

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void libtorrent::aux::utp_stream::on_writeable(utp_stream *s,error_code *ec)

{
  io_context *ctx;
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  undefined8 local_18;
  error_category *peStack_10;
  
  ctx = s->m_io_service;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = (s->m_writeable_handler)._M_invoker;
  p_Var1 = (s->m_writeable_handler).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(s->m_writeable_handler).super__Function_base._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(s->m_writeable_handler).super__Function_base._M_functor + 8);
    (s->m_writeable_handler).super__Function_base._M_manager = (_Manager_type)0x0;
    (s->m_writeable_handler)._M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  local_18._0_4_ = ec->val_;
  local_18._4_1_ = ec->failed_;
  local_18._5_3_ = *(undefined3 *)&ec->field_0x5;
  peStack_10 = ec->cat_;
  boost::asio::
  post<boost::asio::io_context,std::_Bind_result<void,std::function<void(boost::system::error_code_const&)>(boost::system::error_code)>>
            (ctx,(_Bind_result<void,_std::function<void_(const_boost::system::error_code_&)>_(boost::system::error_code)>
                  *)&local_38,(type *)0x0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::function<void_(const_boost::system::error_code_&)>::operator=
            (&s->m_writeable_handler,(nullptr_t)0x0);
  return;
}

Assistant:

void utp_stream::on_writeable(utp_stream* s, error_code const& ec)
{
	UTP_LOGV("%8p: calling writeable handler ec:%s\n"
		, static_cast<void*>(s->m_impl)
		, ec.message().c_str());

	TORRENT_ASSERT(s->m_writeable_handler);
	post(s->m_io_service, std::bind<void>(std::move(s->m_writeable_handler), ec));
	s->m_writeable_handler = nullptr;
}